

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark_branchfree.cpp
# Opt level: O3

void benchmark<unsigned_long>(tasks_t tasks,size_t max,size_t iters)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ostream *poVar4;
  result_t rVar5;
  vector<unsigned_long,_std::allocator<unsigned_long>_> dividers;
  char local_69;
  double local_68;
  double local_60;
  double local_58;
  vector<libdivide::divider<unsigned_long,_(libdivide::Branching)0>,_std::allocator<libdivide::divider<unsigned_long,_(libdivide::Branching)0>_>_>
  local_50;
  ulong local_38;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"----- ",6);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"u64",3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," -----",6);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  local_58 = 0.0;
  if ((tasks & 0x40) == 0) {
    uVar1 = 0;
    local_60 = 0.0;
  }
  else {
    get_primes<unsigned_long,unsigned_long>
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_50,max);
    rVar5 = benchmark_sum_dividers<unsigned_long,std::vector<unsigned_long,std::allocator<unsigned_long>>>
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_50,iters);
    uVar1 = rVar5.sum;
    local_60 = rVar5.duration;
    local_69 = '.';
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,&local_69,1);
    std::ostream::flush();
    if (local_50.
        super__Vector_base<libdivide::divider<unsigned_long,_(libdivide::Branching)0>,_std::allocator<libdivide::divider<unsigned_long,_(libdivide::Branching)0>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_50.
                      super__Vector_base<libdivide::divider<unsigned_long,_(libdivide::Branching)0>,_std::allocator<libdivide::divider<unsigned_long,_(libdivide::Branching)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  if ((tasks >> 8 & 1) == 0) {
    uVar2 = 0;
  }
  else {
    get_primes<libdivide::divider<unsigned_long,(libdivide::Branching)0>,unsigned_long>
              (&local_50,max);
    rVar5 = benchmark_sum_dividers<unsigned_long,std::vector<libdivide::divider<unsigned_long,(libdivide::Branching)0>,std::allocator<libdivide::divider<unsigned_long,(libdivide::Branching)0>>>>
                      (&local_50,iters);
    uVar2 = rVar5.sum;
    local_58 = rVar5.duration;
    local_69 = '.';
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,&local_69,1);
    std::ostream::flush();
    if (local_50.
        super__Vector_base<libdivide::divider<unsigned_long,_(libdivide::Branching)0>,_std::allocator<libdivide::divider<unsigned_long,_(libdivide::Branching)0>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_50.
                      super__Vector_base<libdivide::divider<unsigned_long,_(libdivide::Branching)0>,_std::allocator<libdivide::divider<unsigned_long,_(libdivide::Branching)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  if ((char)tasks < '\0') {
    local_38 = uVar2;
    get_primes<libdivide::divider<unsigned_long,(libdivide::Branching)1>,unsigned_long>
              ((vector<libdivide::divider<unsigned_long,_(libdivide::Branching)1>,_std::allocator<libdivide::divider<unsigned_long,_(libdivide::Branching)1>_>_>
                *)&local_50,max);
    rVar5 = benchmark_sum_dividers<unsigned_long,std::vector<libdivide::divider<unsigned_long,(libdivide::Branching)1>,std::allocator<libdivide::divider<unsigned_long,(libdivide::Branching)1>>>>
                      ((vector<libdivide::divider<unsigned_long,_(libdivide::Branching)1>,_std::allocator<libdivide::divider<unsigned_long,_(libdivide::Branching)1>_>_>
                        *)&local_50,iters);
    uVar3 = rVar5.sum;
    local_68 = rVar5.duration;
    local_69 = '.';
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,&local_69,1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    uVar2 = local_38;
    if (local_50.
        super__Vector_base<libdivide::divider<unsigned_long,_(libdivide::Branching)0>,_std::allocator<libdivide::divider<unsigned_long,_(libdivide::Branching)0>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_50.
                      super__Vector_base<libdivide::divider<unsigned_long,_(libdivide::Branching)0>,_std::allocator<libdivide::divider<unsigned_long,_(libdivide::Branching)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
      uVar2 = local_38;
    }
  }
  else {
    uVar3 = 0;
    local_68 = 0.0;
  }
  if (((~tasks & 0x140) == 0) && (uVar2 != uVar1)) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Error: branchfull_divider<");
    poVar4 = std::operator<<(poVar4,"u64");
    poVar4 = std::operator<<(poVar4,"> sum: ");
  }
  else {
    if (((~tasks & 0xc0) != 0) || (uVar3 == uVar1)) {
      if ((tasks & 0x40) != 0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"    system: ",0xc)
        ;
        poVar4 = std::ostream::_M_insert<double>(local_60);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," seconds",8);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
        std::ostream::put((char)poVar4);
        std::ostream::flush();
      }
      if ((tasks >> 8 & 1) != 0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"branchfull: ",0xc)
        ;
        poVar4 = std::ostream::_M_insert<double>(local_58);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," seconds",8);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
        std::ostream::put((char)poVar4);
        std::ostream::flush();
      }
      if ((char)tasks < '\0') {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"branchfree: ",0xc)
        ;
        poVar4 = std::ostream::_M_insert<double>(local_68);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," seconds",8);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
        std::ostream::put((char)poVar4);
        std::ostream::flush();
      }
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
      std::ostream::put(-0x60);
      std::ostream::flush();
      return;
    }
    poVar4 = std::operator<<((ostream *)&std::cerr,"Error: branchfree_divider<");
    poVar4 = std::operator<<(poVar4,"u64");
    poVar4 = std::operator<<(poVar4,"> sum: ");
    uVar2 = uVar3;
  }
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,uVar2);
  poVar4 = std::operator<<(poVar4,", but system sum: ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,uVar1);
  std::endl<char,std::char_traits<char>>(poVar4);
  exit(1);
}

Assistant:

void benchmark(tasks_t tasks, size_t max, size_t iters) {
    std::cout << "----- " << type_tag<T>::get_tag() << " -----" << std::endl;

    bool test_system = !!(tasks & TEST_SYSTEM);
    bool test_branchfull = !!(tasks & TEST_BRANCHFULL);
    bool test_branchfree = !!(tasks & TEST_BRANCHFREE);

    result_t sys = {0, 0};
    result_t branchfull = {0, 0};
    result_t branchfree = {0, 0};

    size_t st_max = std::min(max, (size_t)std::numeric_limits<T>::max());
    iters = iters * (max / st_max);
    T t_max = (T)st_max;
    if (test_system) {
        using divider_type = T;
        auto dividers = get_primes<divider_type>(t_max);
        sys = benchmark_sum_dividers<T>(dividers, iters);
        std::cout << '.' << std::flush;
    }

    if (test_branchfull) {
        using divider_type = libdivide::divider<T>;
        auto dividers = get_primes<divider_type>(t_max);
        branchfull = benchmark_sum_dividers<T>(dividers, iters);
        std::cout << '.' << std::flush;
    }

    if (test_branchfree) {
        using divider_type = libdivide::branchfree_divider<T>;
        auto dividers = get_primes<divider_type>(t_max);
        branchfree = benchmark_sum_dividers<T>(dividers, iters);
        std::cout << '.' << std::endl;
    }

    if (test_system && test_branchfull && branchfull.sum != sys.sum) {
        std::cerr << "Error: branchfull_divider<" << type_tag<T>::get_tag() << "> sum: " << branchfull.sum
                  << ", but system sum: " << sys.sum << std::endl;
        std::exit(1);
    }

    if (test_system && test_branchfree && branchfree.sum != sys.sum) {
        std::cerr << "Error: branchfree_divider<" << type_tag<T>::get_tag() << "> sum: " << branchfree.sum
                  << ", but system sum: " << sys.sum << std::endl;
        std::exit(1);
    }

    if (test_system) std::cout << "    system: " << sys.duration << " seconds" << std::endl;
    if (test_branchfull)
        std::cout << "branchfull: " << branchfull.duration << " seconds" << std::endl;
    if (test_branchfree)
        std::cout << "branchfree: " << branchfree.duration << " seconds" << std::endl;

    std::cout << std::endl;
}